

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O0

string * __thiscall
soul::Type::getDescription
          (string *__return_storage_ptr__,Type *this,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
          *getStructName)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
  *this_00;
  bool bVar1;
  BoundedIntSize BVar2;
  ArraySize AVar3;
  Structure *__args;
  char *pcVar4;
  allocator<char> local_252;
  allocator<char> local_251;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  Type local_170;
  string local_158;
  Type local_138;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  Type local_a0;
  string local_88;
  Type local_58;
  string local_40;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
  *local_20;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
  *getStructName_local;
  Type *this_local;
  
  local_20 = getStructName;
  getStructName_local =
       (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
        *)this;
  this_local = (Type *)__return_storage_ptr__;
  bVar1 = isConst(this);
  if (bVar1) {
    removeConst(&local_58,this);
    getDescription(&local_40,&local_58,local_20);
    std::operator+(__return_storage_ptr__,"const ",&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    ~Type(&local_58);
  }
  else {
    bVar1 = isReference(this);
    if (bVar1) {
      removeReference(&local_a0,this);
      getDescription(&local_88,&local_a0,local_20);
      std::operator+(__return_storage_ptr__,&local_88,"&");
      std::__cxx11::string::~string((string *)&local_88);
      ~Type(&local_a0);
    }
    else {
      bVar1 = isVector(this);
      if (bVar1) {
        pcVar4 = PrimitiveType::getDescription(&this->primitiveType);
        AVar3 = getVectorSize(this);
        std::__cxx11::to_string(&local_100,AVar3);
        std::operator+(&local_e0,"<",&local_100);
        std::operator+(&local_c0,&local_e0,">");
        std::operator+(__return_storage_ptr__,pcVar4,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
      }
      else {
        bVar1 = isUnsizedArray(this);
        if (bVar1) {
          getArrayElementType(&local_138,this);
          getDescription(&local_120,&local_138,local_20);
          std::operator+(__return_storage_ptr__,&local_120,"[]");
          std::__cxx11::string::~string((string *)&local_120);
          ~Type(&local_138);
        }
        else {
          bVar1 = isArray(this);
          if (bVar1) {
            getArrayElementType(&local_170,this);
            getDescription(&local_158,&local_170,local_20);
            AVar3 = getArraySize(this);
            std::__cxx11::to_string(&local_1d0,AVar3);
            std::operator+(&local_1b0,"[",&local_1d0);
            std::operator+(&local_190,&local_1b0,"]");
            std::operator+(__return_storage_ptr__,&local_158,&local_190);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::__cxx11::string::~string((string *)&local_1d0);
            std::__cxx11::string::~string((string *)&local_158);
            ~Type(&local_170);
          }
          else {
            bVar1 = isWrapped(this);
            if (bVar1) {
              BVar2 = getBoundedIntLimit(this);
              std::__cxx11::to_string(&local_210,BVar2);
              std::operator+(&local_1f0,"wrap<",&local_210);
              std::operator+(__return_storage_ptr__,&local_1f0,">");
              std::__cxx11::string::~string((string *)&local_1f0);
              std::__cxx11::string::~string((string *)&local_210);
            }
            else {
              bVar1 = isClamped(this);
              if (bVar1) {
                BVar2 = getBoundedIntLimit(this);
                std::__cxx11::to_string(&local_250,BVar2);
                std::operator+(&local_230,"clamp<",&local_250);
                std::operator+(__return_storage_ptr__,&local_230,">");
                std::__cxx11::string::~string((string *)&local_230);
                std::__cxx11::string::~string((string *)&local_250);
              }
              else {
                bVar1 = isStruct(this);
                this_00 = local_20;
                if (bVar1) {
                  __args = getStructRef(this);
                  std::
                  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
                  ::operator()(__return_storage_ptr__,this_00,__args);
                }
                else {
                  bVar1 = isStringLiteral(this);
                  if (bVar1) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,"string",&local_251);
                    std::allocator<char>::~allocator(&local_251);
                  }
                  else {
                    pcVar4 = PrimitiveType::getDescription(&this->primitiveType);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,pcVar4,&local_252);
                    std::allocator<char>::~allocator(&local_252);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Type::getDescription (const std::function<std::string(const Structure&)>& getStructName) const
{
    if (isConst())          return "const " + removeConst().getDescription (getStructName);
    if (isReference())      return removeReference().getDescription (getStructName) + "&";
    if (isVector())         return primitiveType.getDescription() + ("<" + std::to_string (getVectorSize()) + ">");
    if (isUnsizedArray())   return getArrayElementType().getDescription (getStructName) + ("[]");
    if (isArray())          return getArrayElementType().getDescription (getStructName) + ("[" + std::to_string (getArraySize()) + "]");
    if (isWrapped())        return "wrap<" + std::to_string (getBoundedIntLimit()) + ">";
    if (isClamped())        return "clamp<" + std::to_string (getBoundedIntLimit()) + ">";
    if (isStruct())         return getStructName (getStructRef());
    if (isStringLiteral())  return "string";

    return primitiveType.getDescription();
}